

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  float r;
  float local_c;
  
  printf("r = ");
  __isoc99_scanf("%f",&local_c);
  printf(anon_var_dwarf_5b,(double)((local_c * local_c * local_c * 4.0) / 3.0) * 3.141592653589793);
  printf(anon_var_dwarf_71,(double)(local_c * local_c * 4.0) * 3.141592653589793);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  float r;
  printf("r = ");
  scanf("%f", &r);

  printf("V = %f m³\n", r * r * r * 4.0f / 3.0f * M_PI);
  printf("S = %f m²\n", r * r * 4.0f * M_PI);

  return 0;
}